

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O0

void GeneratedSaxParser::Utils::fillErrorMsg(ParserChar *dest,ParserChar *src,size_t maxLen)

{
  size_t __n;
  unsigned_long *puVar1;
  void *in_RSI;
  void *in_RDI;
  size_t length;
  size_t bufferLength;
  unsigned_long local_20;
  unsigned_long local_18;
  void *local_10;
  void *local_8;
  
  for (local_20 = 0; *(char *)((long)in_RSI + local_20) != '\0'; local_20 = local_20 + 1) {
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  puVar1 = std::min<unsigned_long>(&local_18,&local_20);
  __n = *puVar1;
  memcpy(local_8,local_10,__n);
  *(undefined1 *)((long)local_8 + __n) = 0;
  return;
}

Assistant:

void Utils::fillErrorMsg(ParserChar* dest, const ParserChar* src, size_t maxLen)
    {
        size_t bufferLength = 0;
        while (src[bufferLength])
            ++bufferLength;
        size_t length = std::min(maxLen, bufferLength);
        memcpy(dest, src, length);
        dest[length] = '\0';
    }